

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

void __thiscall
Serializer::report_exception(Serializer *this,long lineNo,string *expression,exception_ptr *e)

{
  int *t;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *t_00;
  undefined1 auVar1 [12];
  int *e_1;
  string *e_2;
  long *local_48;
  exception *e_3;
  undefined8 local_38;
  exception_ptr local_30;
  exception_ptr *local_28;
  exception_ptr *e_local;
  string *expression_local;
  long lineNo_local;
  Serializer *this_local;
  
  local_28 = e;
  e_local = (exception_ptr *)expression;
  expression_local = (string *)lineNo;
  lineNo_local = (long)this;
  std::__exception_ptr::exception_ptr::exception_ptr(&local_30,e);
  auVar1 = std::rethrow_exception((exception_ptr)&local_30);
  e_3._4_4_ = auVar1._8_4_;
  local_38 = auVar1._0_8_;
  std::__exception_ptr::exception_ptr::~exception_ptr(&local_30);
  if (e_3._4_4_ == 4) {
    t = (int *)__cxa_begin_catch(local_38);
    kiste::raw::text(&this->super_raw,"Caught an int \'");
    kiste::raw::escape<int_const&>(&this->super_raw,t);
    kiste::raw::text(&this->super_raw,"\'");
    this->caughtInt = true;
    __cxa_end_catch();
  }
  else if (e_3._4_4_ == 3) {
    t_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_begin_catch(local_38);
    kiste::raw::text(&this->super_raw,"Caught a std::string \'");
    kiste::raw::escape<std::__cxx11::string_const&>(&this->super_raw,t_00);
    kiste::raw::text(&this->super_raw,"\'");
    this->caughtString = true;
    __cxa_end_catch();
  }
  else if (e_3._4_4_ == 2) {
    local_48 = (long *)__cxa_begin_catch(local_38);
    kiste::raw::text(&this->super_raw,"Caught a std::exception \'");
    e_2 = (string *)(**(code **)(*local_48 + 0x10))();
    kiste::raw::escape<char_const*>(&this->super_raw,(char **)&e_2);
    kiste::raw::text(&this->super_raw,"\'");
    this->caughtException = true;
    __cxa_end_catch();
  }
  else {
    __cxa_begin_catch(local_38);
    kiste::raw::text(&this->super_raw,"Caught an unknown exception");
    __cxa_end_catch();
  }
  kiste::raw::text(&this->super_raw," at line ");
  kiste::raw::escape<long&>(&this->super_raw,(long *)&expression_local);
  kiste::raw::text(&this->super_raw," in expression(");
  kiste::raw::escape<std::__cxx11::string_const&>
            (&this->super_raw,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)e_local);
  kiste::raw::text(&this->super_raw,")");
  return;
}

Assistant:

void report_exception(long lineNo, const std::string& expression, std::exception_ptr e)
  {
    try
    {
      std::rethrow_exception(e);
    }
    catch (const int& e)
    {
      text("Caught an int '");
      escape(e);
      text("'");
      caughtInt = true;
    }
    catch (const std::string& e)
    {
      text("Caught a std::string '");
      escape(e);
      text("'");
      caughtString = true;
    }
    catch (const std::exception& e)
    {
      text("Caught a std::exception '");
      escape(e.what());
      text("'");
      caughtException = true;
    }
    catch (...)
    {
      text("Caught an unknown exception");
    }
    text(" at line ");
    escape(lineNo);
    text(" in expression(");
    escape(expression);
    text(")");
  }